

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
expect<soul::TokenType>
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this,TokenType expected)

{
  bool bVar1;
  TokenType *in_RCX;
  TokenType local_50;
  CompileMessage local_48;
  
  local_50.text = expected.text;
  bVar1 = matchIf<soul::TokenType>(this,expected);
  if (!bVar1) {
    Errors::foundWhenExpecting<soul::TokenType&,soul::TokenType&>
              (&local_48,(Errors *)&this->currentType,&local_50,in_RCX);
    (*this->_vptr_Tokeniser[2])(this,&local_48);
    CompileMessage::~CompileMessage(&local_48);
  }
  return;
}

Assistant:

void expect (Type expected)
    {
        if (! matchIf (expected))
            throwError (Errors::foundWhenExpecting (currentType, expected));
    }